

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O1

MMDB_lookup_result_s *
MMDB_lookup_sockaddr
          (MMDB_lookup_result_s *__return_storage_ptr__,MMDB_s *mmdb,sockaddr *sockaddr,
          int *mmdb_error)

{
  uint8_t *puVar1;
  uint16_t uVar2;
  ushort uVar3;
  uint uVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  bool bVar7;
  uint uVar8;
  ushort uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  uint8_t mapped_address [16];
  code *local_80;
  code *local_78;
  long local_70;
  char *local_68;
  char local_48 [12];
  undefined4 local_3c;
  
  *(undefined8 *)__return_storage_ptr__ = 0;
  (__return_storage_ptr__->entry).mmdb = (MMDB_s *)0x0;
  *(undefined8 *)&(__return_storage_ptr__->entry).offset = 0;
  *(undefined8 *)&__return_storage_ptr__->netmask = 0;
  (__return_storage_ptr__->entry).mmdb = mmdb;
  uVar2 = (mmdb->metadata).ip_version;
  if (uVar2 == 4) {
    iVar10 = 0xb;
    if (sockaddr->sa_family == 10) goto LAB_00103dfc;
    local_68 = sockaddr->sa_data + 2;
  }
  else if (sockaddr->sa_family == 10) {
    local_68 = sockaddr->sa_data + 6;
  }
  else {
    local_68 = local_48;
    local_48[8] = '\0';
    local_48[9] = '\0';
    local_48[10] = '\0';
    local_48[0xb] = '\0';
    local_48[0] = '\0';
    local_48[1] = '\0';
    local_48[2] = '\0';
    local_48[3] = '\0';
    local_48[4] = '\0';
    local_48[5] = '\0';
    local_48[6] = '\0';
    local_48[7] = '\0';
    local_3c = *(undefined4 *)(sockaddr->sa_data + 2);
  }
  uVar3 = mmdb->full_record_byte_size;
  if (uVar3 == 8) {
    local_70 = 4;
    local_80 = get_uint32;
LAB_00103cce:
    bVar7 = false;
    local_78 = local_80;
  }
  else if (uVar3 == 7) {
    local_70 = 3;
    local_78 = get_right_28_bit_record;
    local_80 = get_left_28_bit_record;
    bVar7 = false;
  }
  else {
    if (uVar3 == 6) {
      local_70 = 3;
      local_80 = get_uint24;
      goto LAB_00103cce;
    }
    local_80 = (code *)0x0;
    bVar7 = true;
    local_78 = (code *)0x0;
    local_70 = 0;
  }
  iVar10 = 6;
  if (!bVar7) {
    uVar12 = 0;
    uVar9 = 0;
    if ((uVar2 == 6) && (sockaddr->sa_family == 2)) {
      uVar12 = (ulong)(mmdb->ipv4_start_node).node_value;
      uVar9 = (mmdb->ipv4_start_node).netmask;
    }
    uVar4 = (mmdb->metadata).node_count;
    uVar13 = (ulong)uVar4;
    if (uVar12 < uVar13 && uVar9 < mmdb->depth) {
      puVar5 = mmdb->file_content;
      do {
        lVar11 = uVar12 * uVar3;
        puVar1 = puVar5 + (ulong)uVar3 + lVar11;
        puVar6 = mmdb->data_section;
        if (puVar1 <= puVar6) {
          if (((byte)local_68[uVar9 >> 3] >> (~(byte)uVar9 & 7) & 1) == 0) {
            uVar8 = (*local_80)();
          }
          else {
            uVar8 = (*local_78)(puVar5 + local_70 + lVar11);
          }
          uVar12 = (ulong)uVar8;
        }
        if (puVar6 < puVar1) {
          iVar10 = 2;
          goto LAB_00103dfc;
        }
        uVar9 = uVar9 + 1;
      } while ((uVar9 < mmdb->depth) && (uVar12 < uVar13));
    }
    __return_storage_ptr__->netmask = uVar9;
    iVar10 = 2;
    if (uVar12 < mmdb->data_section_size + uVar4) {
      if (uVar12 == uVar13) {
        __return_storage_ptr__->found_entry = false;
      }
      else {
        __return_storage_ptr__->found_entry = true;
        (__return_storage_ptr__->entry).offset = ((int)uVar12 - (mmdb->metadata).node_count) - 0x10;
      }
      iVar10 = 0;
    }
  }
LAB_00103dfc:
  *mmdb_error = iVar10;
  return __return_storage_ptr__;
}

Assistant:

MMDB_lookup_result_s MMDB_lookup_sockaddr(const MMDB_s *const mmdb,
                                          const struct sockaddr *const sockaddr,
                                          int *const mmdb_error) {
    MMDB_lookup_result_s result = {.found_entry = false,
                                   .netmask = 0,
                                   .entry = {.mmdb = mmdb, .offset = 0}};

    uint8_t mapped_address[16];
    uint8_t const *address;
    if (mmdb->metadata.ip_version == 4) {
        if (sockaddr->sa_family == AF_INET6) {
            *mmdb_error = MMDB_IPV6_LOOKUP_IN_IPV4_DATABASE_ERROR;
            return result;
        }
        address = (uint8_t const *)&((struct sockaddr_in const *)sockaddr)
                      ->sin_addr.s_addr;
    } else {
        if (sockaddr->sa_family == AF_INET6) {
            address = (uint8_t const *)&((struct sockaddr_in6 const *)sockaddr)
                          ->sin6_addr.s6_addr;
        } else {
            address = mapped_address;
            memset(mapped_address, 0, 12);
            memcpy(mapped_address + 12,
                   &((struct sockaddr_in const *)sockaddr)->sin_addr.s_addr,
                   4);
        }
    }

    *mmdb_error = find_address_in_search_tree(
        mmdb, address, sockaddr->sa_family, &result);

    return result;
}